

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulator.c
# Opt level: O0

int poly_compute_vertex_attributes
              (_AL_LIST *vertices,_AL_LIST_ITEM *item,int flags,_AL_LIST *reflex)

{
  _Bool _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  float *point_00;
  float *v0_00;
  float *v1_00;
  long lVar5;
  long in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  float fVar6;
  float *v;
  size_t size;
  _AL_LIST *search_list;
  _AL_LIST_ITEM *start;
  float cross;
  float *v2;
  float *v1;
  float *v0;
  int result;
  _AL_LIST_ITEM *point;
  _AL_LIST_ITEM *next;
  _AL_LIST_ITEM *prev;
  size_t i;
  float *local_90;
  ulong local_88;
  long local_80;
  long local_78;
  undefined4 in_stack_ffffffffffffff90;
  uint local_4c;
  long local_48;
  ulong local_30;
  uint local_4;
  
  uVar2 = _al_list_previous_circular(in_RDI,in_RSI);
  uVar3 = _al_list_next_circular(in_RDI,in_RSI);
  local_4c = 0;
  uVar4 = _al_list_size(in_RDI);
  if (uVar4 < 3) {
    local_4 = 0;
  }
  else {
    point_00 = (float *)_al_list_item_data(uVar2);
    v0_00 = (float *)_al_list_item_data(in_RSI);
    v1_00 = (float *)_al_list_item_data(uVar3);
    fVar6 = (*point_00 - *v0_00) * (v1_00[1] - v0_00[1]) +
            -((point_00[1] - v0_00[1]) * (*v1_00 - *v0_00));
    if (fVar6 < 0.0) {
      local_4c = (uint)((in_EDX & 1) != 0);
    }
    else if ((in_EDX & 2) != 0) {
      if (in_RCX == 0) {
        lVar5 = _al_list_size(in_RDI);
        local_88 = lVar5 - 3;
        local_78 = _al_list_next_circular(in_RDI,uVar3);
        local_80 = in_RDI;
      }
      else {
        local_88 = _al_list_size(in_RCX);
        local_78 = _al_list_front(in_RCX);
        local_80 = in_RCX;
      }
      local_48 = local_78;
      local_30 = 0;
      while (local_30 < local_88) {
        if (local_80 == in_RCX) {
          uVar2 = _al_list_item_data(local_48);
          local_90 = (float *)_al_list_item_data(uVar2);
        }
        else {
          local_90 = (float *)_al_list_item_data(local_48);
        }
        if ((((local_90 != point_00) && (local_90 != v0_00)) && (local_90 != v1_00)) &&
           (_Var1 = _al_prim_is_point_in_triangle
                              (point_00,v0_00,v1_00,
                               (float *)CONCAT44(fVar6,in_stack_ffffffffffffff90)), _Var1)) {
          local_48 = 0;
          break;
        }
        local_30 = local_30 + 1;
        local_48 = _al_list_next_circular(local_80,local_48);
      }
      if ((local_48 != 0) || (uVar4 = _al_list_is_empty(local_80), (uVar4 & 1) != 0)) {
        local_4c = 2;
      }
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

static int poly_compute_vertex_attributes(_AL_LIST* vertices, _AL_LIST_ITEM* item, int flags, _AL_LIST* reflex)
{
   size_t i;
   _AL_LIST_ITEM* prev = _al_list_previous_circular(vertices, item);
   _AL_LIST_ITEM* next = _al_list_next_circular(vertices, item);
   _AL_LIST_ITEM* point = NULL;
   int result = 0;
   float* v0;
   float* v1;
   float* v2;
   float cross;

   // Oops, degenerate triangle in store.
   if (_al_list_size(vertices) < 3)
      return result;

   // Get points.
   v0 = (float*)_al_list_item_data(prev);
   v1 = (float*)_al_list_item_data(item);
   v2 = (float*)_al_list_item_data(next);

   // Compute the cross product between the two edges
   cross = (v0[0] - v1[0]) * (v2[1] - v1[1]) - (v0[1] - v1[1]) * (v2[0] - v1[0]);

# if POLY_DEBUG
   if (g_poly_debug_step == g_poly_debug_step_current) {

      float step = 0.25f * 0.0f;

      float dir0[2] = { v0[0] - v1[0], v0[1] - v1[1] };
      float dir2[2] = { v2[0] - v1[0], v2[1] - v1[1] };

      POLY_DEBUG_TEXT(v1[0], v1[1], "%d", cross > 0);

      al_draw_line(v1[0], v1[1], v1[0] + dir0[0] * step, v1[1] + dir0[1] * step, al_map_rgb(255, 0, 0), 4.0f * g_poly_debug_scale);
      al_draw_line(v1[0], v1[1], v1[0] + dir2[0] * step, v1[1] + dir2[1] * step, al_map_rgb(255, 0, 0), 4.0f * g_poly_debug_scale);
   }
# endif

   // If internal angle is less than 180 degrees then we may
   // have an ear clip vertex, otherwise we have reflex.
   if (cross >= 0)
   {
      if (flags & POLY_VERTEX_ATTR_EAR_CLIP)
      {
         _AL_LIST_ITEM* start;
         _AL_LIST* search_list;
         size_t size;

         if (reflex) {

            search_list = reflex;
            size        = _al_list_size(search_list);
            start       = _al_list_front(reflex);
         }
         else {
            search_list = vertices;
            size        = _al_list_size(search_list) - 3;
            start       = _al_list_next_circular(search_list, next);
         }

         // Check for ear vertex.
         point = start;
         for (i = 0; i < size; ++i, point = _al_list_next_circular(search_list, point)) {

            float* v;

            // TODO: optimize this by removing if
            if (search_list == reflex)
               v = (float*)_al_list_item_data((_AL_LIST_ITEM*)_al_list_item_data(point));
            else
               v = (float*)_al_list_item_data(point);

            // Ignore vertices which belong to the triangle.
            if ((v == v0) || (v == v1) || (v == v2))
               continue;

            // Set point to NULL if we find any point inside the triangle.
            if (_al_prim_is_point_in_triangle(v, v0, v1, v2)) {
               point = NULL;
               break;
            }
         }

         // If point is not NULL, we have ear vertex.
         if ((NULL != point) || _al_list_is_empty(search_list))
            result |= POLY_VERTEX_ATTR_EAR_CLIP;
      }
   }
   else if (flags & POLY_VERTEX_ATTR_REFLEX)
      result |= POLY_VERTEX_ATTR_REFLEX;

   return result;
}